

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O1

void __thiscall
RigidBodyDynamics::LoopConstraint::calcPositionError
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *errSysUpd,
          ConstraintCache *cache,bool updateKinematics)

{
  uint uVar1;
  _Bit_type *p_Var2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double dVar5;
  ActualDstType actualDst;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  Matrix3d *local_88;
  pointer local_80;
  Matrix3d local_78;
  
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_78,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x4c8) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x4b8) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x4c0) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcBodyWorldOrientation
            (&local_78,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,updateKinematics);
  local_80 = (this->super_Constraint).bodyFrames.
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_88 = &local_78;
  Matrix3_t::operator=
            ((Matrix3_t *)(cache + 0x470),
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_88);
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_78,model,Q,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             &(this->super_Constraint).bodyFrames.
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start[1].r,updateKinematics);
  *(double *)(cache + 0x528) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x518) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x520) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcBodyWorldOrientation
            (&local_78,model,Q,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],updateKinematics);
  local_80 = (this->super_Constraint).bodyFrames.
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  local_88 = &local_78;
  Matrix3_t::operator=
            ((Matrix3_t *)(cache + 0x4d0),
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_88);
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = (double)(cache + 0x470);
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = (double)(cache + 0x4d0);
  Matrix3_t::operator=
            ((Matrix3_t *)(cache + 0xe0),
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_78);
  dVar5 = (*(double *)(cache + 0xf0) - *(double *)(cache + 0x110)) * -0.5;
  auVar4._8_4_ = SUB84(dVar5,0);
  auVar4._0_8_ = (*(double *)(cache + 0x118) - *(double *)(cache + 0x108)) * -0.5;
  auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
  *(undefined1 (*) [16])(cache + 0x350) = auVar4;
  *(double *)(cache + 0x360) = (*(double *)(cache + 0xf8) - *(double *)(cache + 0xe8)) * -0.5;
  dVar9 = *(double *)(cache + 0x518) - *(double *)(cache + 0x4b8);
  dVar10 = *(double *)(cache + 0x520) - *(double *)(cache + 0x4c0);
  dVar5 = *(double *)(cache + 0x528) - *(double *)(cache + 0x4c8);
  *(double *)(cache + 0x368) =
       *(double *)(cache + 0x478) * dVar10 + *(double *)(cache + 0x470) * dVar9 +
       dVar5 * *(double *)(cache + 0x480);
  *(double *)(cache + 0x370) =
       *(double *)(cache + 0x490) * dVar10 + *(double *)(cache + 0x488) * dVar9 +
       dVar5 * *(double *)(cache + 0x498);
  *(double *)(cache + 0x378) =
       *(double *)(cache + 0x4a8) * dVar10 + *(double *)(cache + 0x4a0) * dVar9 +
       *(double *)(cache + 0x4b0) * dVar5;
  uVar6 = (ulong)(this->super_Constraint).sizeOfConstraint;
  if (uVar6 != 0) {
    p_Var2 = (this->super_Constraint).positionConstraint.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar1 = (this->super_Constraint).rowInSystem;
    pdVar3 = (errSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar7 = (double *)(*(long *)&(this->super_Constraint).field_0xd8 + 0x20);
    uVar8 = 0;
    do {
      if ((p_Var2[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        dVar5 = 0.0;
      }
      else {
        dVar5 = pdVar7[1] * *(double *)(cache + 0x378) + pdVar7[-1] * *(double *)(cache + 0x368) +
                pdVar7[-3] * *(double *)(cache + 0x358) +
                *pdVar7 * *(double *)(cache + 0x370) + pdVar7[-2] * *(double *)(cache + 0x360) +
                pdVar7[-4] * *(double *)(cache + 0x350);
      }
      pdVar3[uVar1 + (int)uVar8] = dVar5;
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + 6;
    } while (uVar6 != uVar8);
  }
  return;
}

Assistant:

void LoopConstraint::calcPositionError(Model &model,
                                      const double time,
                                      const Math::VectorNd &Q,
                                      Math::VectorNd &errSysUpd,
                                      ConstraintCache &cache,
                                      bool updateKinematics)
{

  // Constraints computed in the predecessor body frame.


  // Compute the position of the two contact points.

  //Kp: predecessor frame
  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;

  //Ks: successor frame
  cache.stB.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[1],bodyFrames[1].r,
                                          updateKinematics);
  cache.stB.E = CalcBodyWorldOrientation(model,Q,bodyIds[1],updateKinematics
                                         ).transpose()*bodyFrames[1].E;


  // Compute the orientation from the predecessor to the successor frame.

  cache.mat3A = cache.stA.E.transpose()*cache.stB.E;

  // The first three elements represent the rotation error.
  // This formulation is equivalent to u * sin(theta), where u and theta are
  // the angle-axis of rotation from the predecessor to the successor frame.
  // These quantities are expressed in the predecessor frame. This is also
  // similar to the rotation error calculation that appears in Table 8.1 of
  // Featherstone.
  cache.svecA[0] = -0.5*(cache.mat3A(1,2)-cache.mat3A(2,1));
  cache.svecA[1] = -0.5*(cache.mat3A(2,0)-cache.mat3A(0,2));
  cache.svecA[2] = -0.5*(cache.mat3A(0,1)-cache.mat3A(1,0));

  // The last three elements represent the position error.
  // It is equivalent to the difference in the position of the two
  // constraint points. The distance is projected on the predecessor frame
  // to be consistent with the rotation.

  //Qn: Should this be multiplied by -0.5 to be consistent with table 8.1?
  //For now I'm leaving this as is: this is equivalent to the functioning
  //original loop constraint code.
  cache.svecA.block(3,0,3,1)=cache.stA.E.transpose()*(cache.stB.r-cache.stA.r);

  for(unsigned int i=0; i<sizeOfConstraint;++i){
    if(positionConstraint[i]){
      errSysUpd[rowInSystem+i] = T[i].transpose()*cache.svecA;
    }else{
      errSysUpd[rowInSystem+i] = 0.;
    }
  }

}